

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.cpp
# Opt level: O1

EventDefinition * findEventByName(String *a)

{
  EventDefinition *this;
  _Elt_pointer ppEVar1;
  int iVar2;
  _Elt_pointer ppEVar3;
  _Map_pointer pppEVar4;
  _Elt_pointer ppEVar5;
  bool bVar6;
  String local_70;
  String local_50;
  
  ppEVar1 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppEVar3 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_last;
  pppEVar4 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  ppEVar5 = Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if (Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>._M_impl
      .super__Deque_impl_data._M_start._M_cur !=
      Events._deque.super__Deque_base<EventDefinition_*,_std::allocator<EventDefinition_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur) {
    do {
      this = *ppEVar5;
      String::toUppercase(&local_70,a);
      String::toUppercase(&local_50,&this->name);
      if (local_70._string._M_string_length == local_50._string._M_string_length) {
        if (local_70._string._M_string_length == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(local_70._string._M_dataplus._M_p,local_50._string._M_dataplus._M_p,
                       local_70._string._M_string_length);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
        operator_delete(local_50._string._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._string._M_dataplus._M_p != &local_70._string.field_2) {
        operator_delete(local_70._string._M_dataplus._M_p);
      }
      if (bVar6) {
        return this;
      }
      ppEVar5 = ppEVar5 + 1;
      if (ppEVar5 == ppEVar3) {
        ppEVar5 = pppEVar4[1];
        pppEVar4 = pppEVar4 + 1;
        ppEVar3 = ppEVar5 + 0x40;
      }
    } while (ppEVar5 != ppEVar1);
  }
  return (EventDefinition *)0x0;
}

Assistant:

EventDefinition* findEventByName (String a)
{
	for (EventDefinition* e : Events)
	{
		if (a.toUppercase() == e->name.toUppercase())
			return e;
	}

	return null;
}